

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.h
# Opt level: O2

void __thiscall Assimp::PLY::Element::~Element(Element *this)

{
  std::__cxx11::string::~string((string *)&this->szName);
  std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::~vector
            (&this->alProperties);
  return;
}

Assistant:

Element() AI_NO_EXCEPT
    : eSemantic (EEST_INVALID)
    , NumOccur(0) {
        // empty
    }